

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboTestUtil.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::FboTestUtil::GradientShader::shadeFragments
          (GradientShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  pointer pUVar1;
  int i;
  long lVar2;
  GenericVec4 *pGVar3;
  int iVar4;
  deUint32 dVar5;
  FragmentPacket *packet;
  int fragNdx;
  int fragNdx_00;
  int iVar6;
  UVec4 uicolor;
  IVec4 icolor;
  Vec4 color;
  Vec4 fv;
  Vec4 gradientMin;
  Vec4 coord;
  Vec4 gradientMax;
  float local_c8;
  deUint32 dStack_c4;
  undefined8 uStack_c0;
  float local_b8;
  deUint32 dStack_b4;
  undefined8 uStack_b0;
  Vec4 local_a8;
  float local_90 [4];
  ulong local_80;
  FragmentPacket *local_78;
  ulong local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  float local_58;
  float local_54;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pUVar1 = (this->super_ShaderProgram).m_uniforms.
           super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_68 = *(undefined8 *)&pUVar1->value;
  uStack_60 = *(undefined8 *)((long)&pUVar1->value + 8);
  local_48 = *(undefined8 *)&pUVar1[1].value;
  uStack_40 = *(undefined8 *)((long)&pUVar1[1].value + 8);
  if (0 < numPackets) {
    local_80 = (ulong)(uint)numPackets;
    local_70 = 0;
    local_78 = packets;
    do {
      packet = local_78 + local_70;
      iVar6 = (int)local_70 * 4;
      fragNdx_00 = 0;
      do {
        rr::readTriangleVarying<float>((rr *)&local_58,packet,context,0,fragNdx_00);
        local_90[0] = (local_58 + local_54) * 0.5;
        local_90[1] = (local_58 - local_54) * 0.5 + 0.5;
        local_90[2] = 1.0 - local_90[0];
        local_90[3] = 1.0 - local_90[1];
        _local_c8 = 0;
        uStack_c0 = 0;
        lVar2 = 0;
        do {
          (&local_c8)[lVar2] =
               *(float *)((long)&local_48 + lVar2 * 4) - *(float *)((long)&local_68 + lVar2 * 4);
          lVar2 = lVar2 + 1;
        } while (lVar2 != 4);
        _local_b8 = 0;
        uStack_b0 = 0;
        lVar2 = 0;
        do {
          (&local_b8)[lVar2] = (&local_c8)[lVar2] * local_90[lVar2];
          lVar2 = lVar2 + 1;
        } while (lVar2 != 4);
        local_a8.m_data[0] = 0.0;
        local_a8.m_data[1] = 0.0;
        local_a8.m_data[2] = 0.0;
        local_a8.m_data[3] = 0.0;
        lVar2 = 0;
        do {
          local_a8.m_data[lVar2] = *(float *)((long)&local_68 + lVar2 * 4) + (&local_b8)[lVar2];
          lVar2 = lVar2 + 1;
        } while (lVar2 != 4);
        castVectorSaturate<int>(&local_a8);
        castVectorSaturate<unsigned_int>(&local_a8);
        iVar4 = *(int *)&(this->super_ShaderProgram).field_0x154;
        if (iVar4 == 0x22) {
          pGVar3 = context->outputArray;
          lVar2 = (long)((iVar6 + fragNdx_00) * context->numFragmentOutputs);
          pGVar3[lVar2].v.uData[0] = (deUint32)local_c8;
          pGVar3[lVar2].v.uData[1] = dStack_c4;
          pGVar3[lVar2].v.uData[2] = (deUint32)uStack_c0;
          dVar5 = uStack_c0._4_4_;
LAB_012cb434:
          pGVar3[lVar2].v.uData[3] = dVar5;
        }
        else {
          if (iVar4 == 0x1e) {
            pGVar3 = context->outputArray;
            lVar2 = (long)((iVar6 + fragNdx_00) * context->numFragmentOutputs);
            pGVar3[lVar2].v.uData[0] = (deUint32)local_b8;
            pGVar3[lVar2].v.uData[1] = dStack_b4;
            pGVar3[lVar2].v.uData[2] = (deUint32)uStack_b0;
            dVar5 = uStack_b0._4_4_;
            goto LAB_012cb434;
          }
          if (iVar4 == 4) {
            pGVar3 = context->outputArray;
            iVar4 = (iVar6 + fragNdx_00) * context->numFragmentOutputs;
            pGVar3[iVar4].v.uData[0] = (deUint32)local_a8.m_data[0];
            pGVar3[iVar4].v.uData[1] = (deUint32)local_a8.m_data[1];
            pGVar3[iVar4].v.uData[2] = (deUint32)local_a8.m_data[2];
            pGVar3[iVar4].v.uData[3] = (deUint32)local_a8.m_data[3];
          }
        }
        fragNdx_00 = fragNdx_00 + 1;
      } while (fragNdx_00 != 4);
      local_70 = local_70 + 1;
    } while (local_70 != local_80);
  }
  return;
}

Assistant:

void GradientShader::shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	const tcu::Vec4	gradientMin(m_uniforms[0].value.f4);
	const tcu::Vec4	gradientMax(m_uniforms[1].value.f4);

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
	{
		const tcu::Vec4		coord	= rr::readTriangleVarying<float>(packets[packetNdx], context, 0, fragNdx);
		const float			x		= coord.x();
		const float			y		= coord.y();
		const float			f0		= (x + y) * 0.5f;
		const float			f1		= 0.5f + (x - y) * 0.5f;
		const tcu::Vec4		fv		= Vec4(f0, f1, 1.0f-f0, 1.0f-f1);

		const tcu::Vec4		color	= gradientMin + (gradientMax-gradientMin) * fv;
		const tcu::IVec4	icolor	= castVectorSaturate<deInt32>(color);
		const tcu::UVec4	uicolor	= castVectorSaturate<deUint32>(color);

		if (m_outputType == glu::TYPE_FLOAT_VEC4)			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, color);
		else if (m_outputType == glu::TYPE_INT_VEC4)		rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, icolor);
		else if (m_outputType == glu::TYPE_UINT_VEC4)		rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, uicolor);
		else
			DE_ASSERT(DE_FALSE);
	}
}